

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_Internal_ExtrudedEdge * __thiscall
ON_SimpleArray<ON_Internal_ExtrudedEdge>::AppendNew(ON_SimpleArray<ON_Internal_ExtrudedEdge> *this)

{
  int iVar1;
  ON_Internal_ExtrudedEdge *pOVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = this->m_count;
  if (uVar3 == this->m_capacity) {
    if ((int)uVar3 < 8 || (ulong)((long)(int)uVar3 << 6) < 0x10000001) {
      uVar4 = 4;
      if (2 < (int)uVar3) {
        uVar4 = uVar3 * 2;
      }
    }
    else {
      uVar4 = 0x400008;
      if (uVar3 < 0x400008) {
        uVar4 = uVar3;
      }
      uVar4 = uVar4 + uVar3;
    }
    if (uVar3 < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
      uVar3 = this->m_count;
    }
  }
  pOVar2 = this->m_a;
  pOVar2[(int)uVar3].m_extruded_vertex[1] = (ON_Internal_ExtrudedVertex *)0x0;
  (pOVar2[(int)uVar3].m_extruded_vertex + 1)[1] = (ON_Internal_ExtrudedVertex *)0x0;
  pOVar2[(int)uVar3].m_copied_edge = (ON_SubDEdge *)0x0;
  (&pOVar2[(int)uVar3].m_copied_edge)[1] = (ON_SubDEdge *)0x0;
  *(undefined8 *)&pOVar2[(int)uVar3].m_side_group_id = 0;
  *(ON_SubDEdge **)(&pOVar2[(int)uVar3].m_side_group_id + 2) = (ON_SubDEdge *)0x0;
  pOVar2 = pOVar2 + (int)uVar3;
  pOVar2->m_initial_edge_tag = Unset;
  *(undefined3 *)&pOVar2->field_0x1 = 0;
  pOVar2->m_initial_vertex_id[0] = 0;
  *(undefined8 *)(pOVar2->m_initial_vertex_id + 1) = 0;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  return this->m_a + iVar1;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}